

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O1

int cvNlsFPFunction(N_Vector ycor,N_Vector res,void *cvode_mem)

{
  int iVar1;
  int iVar2;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","cvNlsFPFunction","cvode_mem = NULL illegal.");
  }
  else {
    N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0x60),1.0,ycor,
                 *(N_Vector *)((long)cvode_mem + 0xd0));
    iVar1 = (**(code **)((long)cvode_mem + 0x3d8))
                      (*(undefined8 *)((long)cvode_mem + 0x168),
                       *(undefined8 *)((long)cvode_mem + 0xd0),res,
                       *(undefined8 *)((long)cvode_mem + 0x18));
    *(long *)((long)cvode_mem + 0x360) = *(long *)((long)cvode_mem + 0x360) + 1;
    if (iVar1 < 0) {
      iVar2 = -8;
    }
    else {
      iVar2 = 10;
      if (iVar1 == 0) {
        N_VLinearSum(*(realtype *)((long)cvode_mem + 0x140),res,-1.0,
                     *(N_Vector *)((long)cvode_mem + 0x68),res);
        N_VScale(*(realtype *)((long)cvode_mem + 0x280),res,res);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int cvNlsFPFunction(N_Vector ycor, N_Vector res, void* cvode_mem)
{
 CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "cvNlsFPFunction", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* update the state based on the current correction */
  N_VLinearSum(ONE, cv_mem->cv_zn[0], ONE, ycor, cv_mem->cv_y);

  /* evaluate the rhs function */
  retval = cv_mem->nls_f(cv_mem->cv_tn, cv_mem->cv_y, res,
                         cv_mem->cv_user_data);
  cv_mem->cv_nfe++;
  if (retval < 0) return(CV_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  N_VLinearSum(cv_mem->cv_h, res, -ONE, cv_mem->cv_zn[1], res);
  N_VScale(cv_mem->cv_rl1, res, res);

  return(CV_SUCCESS);
}